

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

matrix<double> * __thiscall
mat_lib::matrix<double>::inverse(matrix<double> *__return_storage_ptr__,matrix<double> *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  logic_error *this_00;
  int i_1;
  ulong uVar9;
  int j;
  int i;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int i_2;
  element_t *peVar13;
  int j_2;
  ulong uVar14;
  long lVar15;
  double *temp;
  int j_1;
  ulong uVar16;
  ulong uVar17;
  
  uVar12 = this->rows__;
  if ((uVar12 == this->columns__) && (uVar11 = uVar12 * uVar12, 1 < uVar11)) {
    uVar17 = -(ulong)(uVar11 + 2 >> 0x3d != 0) | uVar11 * 8 + 0x10;
    pvVar7 = operator_new__(uVar17);
    for (lVar10 = 0; uVar11 - lVar10 != 0; lVar10 = lVar10 + 1) {
      pvVar8 = operator_new__(uVar17);
      *(void **)((long)pvVar7 + lVar10 * 8) = pvVar8;
    }
    for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
      for (lVar10 = 0; uVar12 * 2 != lVar10; lVar10 = lVar10 + 1) {
        *(undefined8 *)(*(long *)((long)pvVar7 + uVar11 * 8) + lVar10 * 8) = 0;
      }
    }
    lVar10 = 0;
    for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
      peVar13 = this->elements__;
      for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
        *(undefined8 *)(*(long *)((long)pvVar7 + uVar11 * 8) + uVar17 * 8) =
             *(undefined8 *)((long)peVar13 + uVar17 * 8 + lVar10);
      }
      lVar10 = lVar10 + uVar12 * 8;
    }
    matrix(__return_storage_ptr__,uVar12,uVar12);
    iVar5 = (int)uVar12;
    uVar6 = iVar5 * 2;
    uVar17 = 0;
    uVar11 = 0;
    if (0 < (int)uVar6) {
      uVar11 = (ulong)uVar6;
    }
    uVar9 = 0;
    if (0 < iVar5) {
      uVar9 = uVar12 & 0xffffffff;
    }
    uVar14 = uVar12 & 0xffffffff;
    for (; uVar17 != uVar9; uVar17 = uVar17 + 1) {
      for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
        if (uVar14 == uVar16) {
          *(undefined8 *)
           (*(long *)((long)pvVar7 + uVar17 * 8) + (ulong)(uint)((int)uVar17 + iVar5) * 8) =
               0x3ff0000000000000;
        }
      }
      uVar14 = (ulong)((int)uVar14 + 1);
    }
    for (uVar17 = uVar12 & 0xffffffff; 1 < (int)uVar17; uVar17 = uVar17 - 1) {
      pdVar3 = *(double **)((long)pvVar7 + uVar17 * 8 + -0x10);
      pdVar4 = *(double **)((long)pvVar7 + uVar17 * 8 + -8);
      dVar1 = *pdVar4;
      if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
        *(double **)((long)pvVar7 + uVar17 * 8 + -8) = pdVar3;
        *(double **)((long)pvVar7 + uVar17 * 8 + -0x10) = pdVar4;
      }
    }
    for (uVar17 = 0; uVar17 != uVar9; uVar17 = uVar17 + 1) {
      for (uVar14 = 0; uVar14 != (uVar12 & 0xffffffff); uVar14 = uVar14 + 1) {
        if (uVar14 != uVar17) {
          lVar10 = *(long *)((long)pvVar7 + uVar14 * 8);
          dVar1 = *(double *)(lVar10 + uVar17 * 8);
          lVar15 = *(long *)((long)pvVar7 + uVar17 * 8);
          dVar2 = *(double *)(lVar15 + uVar17 * 8);
          for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
            *(double *)(lVar10 + uVar16 * 8) =
                 *(double *)(lVar10 + uVar16 * 8) -
                 *(double *)(lVar15 + uVar16 * 8) * (dVar1 / dVar2);
          }
        }
      }
    }
    for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      lVar10 = *(long *)((long)pvVar7 + uVar12 * 8);
      dVar1 = *(double *)(lVar10 + uVar12 * 8);
      for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
        *(double *)(lVar10 + uVar17 * 8) = *(double *)(lVar10 + uVar17 * 8) / dVar1;
      }
    }
    lVar10 = 0;
    for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      peVar13 = (element_t *)
                (__return_storage_ptr__->columns__ * lVar10 +
                (long)__return_storage_ptr__->elements__);
      for (lVar15 = (long)iVar5; lVar15 < (int)uVar6; lVar15 = lVar15 + 1) {
        *peVar13 = *(element_t *)(*(long *)((long)pvVar7 + uVar12 * 8) + lVar15 * 8);
        peVar13 = peVar13 + 1;
      }
      lVar10 = lVar10 + 8;
    }
    operator_delete__(pvVar7);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,
             "Inverse operation not possible, the elementsPointer need be square and the order grater than one"
            );
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

matrix<T> matrix<T>::inverse() {
        if(rows() != columns() || rows()*columns() <= 1)
            throw logic_error("Inverse operation not possible, "
                              "the elementsPointer need be square and the order grater than one");

        int order = rows();

        // Copy the elements
        T** matrix_elements = new T*[this->size() + 2];

        for(int i = 0; i < this->size(); i++)
            matrix_elements[i] = new double[this->size() + 2];

        for(int i = 0; i < rows(); i++)
            for(int j = 0; j < 2 * columns(); j++)
                matrix_elements[i][j] = 0;

        for(int i = 0; i < rows(); i++)
            for(int j = 0; j < columns(); j++)
                matrix_elements[i][j] = elements__[offset__(i,j)];

        // create the inverse matrix
        matrix<T> inverse_matrix (rows(), columns());

        double temp;

        for(int i = 0; i < order; i++) {
            for (int j = 0; j < 2 * order; j++) {
                if (j == (i + order)) {
                    matrix_elements[i][j] = 1;

                }
            }
        }

        for(int i = order -1; i > 0; i--) {
            if (matrix_elements[i - 1][0] < matrix_elements[i][0]) {
                double* temp = matrix_elements[i];
                matrix_elements[i] = matrix_elements[i - 1];
                matrix_elements[i - 1] = temp;
            }
        }


        for (int i = 0; i < order; i++) {
            for (int j = 0; j < order; j++) {
                if (j != i) {
                    temp = matrix_elements[j][i] / matrix_elements[i][i];
                    for(int k = 0; k < 2 * order; k++)
                        matrix_elements[j][k] -= matrix_elements[i][k] * temp;

                }
            }
        }

        for(int i = 0; i < order; i++) {
            temp = matrix_elements[i][i];
            for(int j = 0; j < 2 * order; j++) {
                matrix_elements[i][j] = matrix_elements[i][j] / temp;

            }
        }

        for(int i = 0; i < order; i++)
            for(int j = order; j < 2*order; j++) {
                inverse_matrix[i][j - order] = matrix_elements[i][j];
            }



        delete [] matrix_elements;

        return inverse_matrix;
    }